

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int check_exif(spng_exif *exif)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((exif != (spng_exif *)0x0) && (piVar1 = (int *)exif->data, piVar1 != (int *)0x0)) {
    iVar2 = 0x11;
    if (((3 < exif->length) && (iVar2 = 0x4f, exif->length < 0x80000000)) &&
       ((*piVar1 == 0x2a4949 || (iVar2 = 1, *piVar1 == 0x2a004d4d)))) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int check_exif(const struct spng_exif *exif)
{
    if(exif == NULL) return 1;
    if(exif->data == NULL) return 1;

    if(exif->length < 4) return SPNG_ECHUNK_SIZE;
    if(exif->length > spng_u32max) return SPNG_ECHUNK_STDLEN;

    const uint8_t exif_le[4] = { 73, 73, 42, 0 };
    const uint8_t exif_be[4] = { 77, 77, 0, 42 };

    if(memcmp(exif->data, exif_le, 4) && memcmp(exif->data, exif_be, 4)) return 1;

    return 0;
}